

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 12-module-1.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  vector<lest::test,_std::allocator<lest::test>_> local_30;
  
  specification();
  std::vector<lest::test,_std::allocator<lest::test>_>::vector(&local_30,&specification::tests);
  iVar1 = lest::run(&local_30,argc,argv,(ostream *)&std::cout);
  std::vector<lest::test,_std::allocator<lest::test>_>::~vector(&local_30);
  return iVar1;
}

Assistant:

int main( int argc, char * argv[] )
{
    return lest::run( specification(), argc, argv /*, std::cout */ );
}